

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>::
setupSmallBuildRefBuilder
          (BVHNBuilderTwoLevel<8,_embree::TriangleMesh,_embree::TriangleMi<4>_> *this,
          size_t objectID,TriangleMesh *param_2)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  undefined8 *puVar4;
  
  lVar1 = *(long *)(this + 0x10);
  plVar2 = *(long **)(lVar1 + objectID * 8);
  if (plVar2 == (long *)0x0) {
    puVar4 = (undefined8 *)::operator_new(0x10);
    *puVar4 = &PTR__RefBuilderBase_021ec310;
    puVar4[1] = objectID;
    *(undefined8 **)(lVar1 + objectID * 8) = puVar4;
  }
  else {
    lVar3 = __dynamic_cast(plVar2,&BVHNBuilderTwoLevel<8,embree::TriangleMesh,embree::TriangleMi<4>>
                                   ::RefBuilderBase::typeinfo,
                           &BVHNBuilderTwoLevel<8,embree::TriangleMesh,embree::TriangleMi<4>>::
                            RefBuilderSmall::typeinfo,0);
    if (lVar3 == 0) {
      puVar4 = (undefined8 *)::operator_new(0x10);
      *puVar4 = &PTR__RefBuilderBase_021ec310;
      puVar4[1] = objectID;
      *(undefined8 **)(lVar1 + objectID * 8) = puVar4;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))(plVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::setupSmallBuildRefBuilder (size_t objectID, Mesh const * const /*mesh*/)
    {
      if (builders[objectID] == nullptr ||                                         // new mesh
          dynamic_cast<RefBuilderSmall*>(builders[objectID].get()) == nullptr)     // size change resulted in large->small change
      {
        builders[objectID].reset (new RefBuilderSmall(objectID));
      }
    }